

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

float similarity(string *s0,string *s1)

{
  ulong uVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  pointer piVar6;
  pointer piVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  vector<int,_std::allocator<int>_> col;
  vector<int,_std::allocator<int>_> prevCol;
  allocator_type local_7d;
  value_type_conflict3 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  string *local_48;
  string *local_40;
  ulong local_38;
  long lVar19;
  
  local_38 = s0->_M_string_length;
  uVar12 = s1->_M_string_length;
  uVar1 = uVar12 + 1;
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_48 = s0;
  local_40 = s1;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78,uVar1,(value_type_conflict3 *)&local_60,(allocator_type *)&local_7c);
  local_7c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,uVar1,&local_7c,&local_7d);
  auVar5 = _DAT_001220a0;
  if (uVar1 != 0) {
    auVar17._8_4_ = (int)uVar12;
    auVar17._0_8_ = uVar12;
    auVar17._12_4_ = (int)(uVar12 >> 0x20);
    lVar8 = 0;
    auVar17 = auVar17 ^ _DAT_001220a0;
    auVar18 = _DAT_00122090;
    do {
      auVar20 = auVar18 ^ auVar5;
      if ((bool)(~(auVar20._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar20._0_4_ ||
                  auVar17._4_4_ < auVar20._4_4_) & 1)) {
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = (int)lVar8;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8 + 1] = (int)lVar8 + 1;
      }
      lVar8 = lVar8 + 2;
      lVar19 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar19 + 2;
    } while ((uVar12 & 0xfffffffffffffffe) + 2 != lVar8);
  }
  if (local_38 != 0xffffffffffffffff) {
    piVar6 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    uVar9 = 0;
    piVar7 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = piVar7;
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piVar6;
      *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = (int)uVar9;
      if (1 < uVar1) {
        pcVar3 = (local_48->_M_dataplus)._M_p;
        pcVar4 = (local_40->_M_dataplus)._M_p;
        uVar14 = 0;
        uVar11 = uVar9 & 0xffffffff;
        do {
          if (uVar9 == 0) {
            uVar15 = 1;
          }
          else {
            uVar15 = (uint)(pcVar3[uVar9 - 1] != pcVar4[uVar14]);
          }
          uVar10 = (int)uVar11 + 1;
          uVar13 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14 + 1] + 1U;
          if ((int)uVar10 <=
              (int)(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14 + 1] + 1U)) {
            uVar13 = uVar10;
          }
          if ((int)(uVar15 + local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar14]) < (int)uVar13) {
            uVar13 = uVar15 + local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar14];
          }
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14 + 1] = uVar13;
          uVar14 = uVar14 + 1;
          uVar11 = (ulong)uVar13;
        } while (uVar12 != uVar14);
      }
      bVar16 = uVar9 != local_38;
      piVar6 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      uVar9 = uVar9 + 1;
      piVar7 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (bVar16);
  }
  iVar2 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12];
  uVar1 = local_48->_M_string_length;
  uVar12 = local_40->_M_string_length;
  operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (uVar12 < uVar1) {
    uVar12 = uVar1;
  }
  return 1.0 - (float)iVar2 / (float)uVar12;
}

Assistant:

float similarity(const std::string & s0, const std::string & s1) {
    const size_t len0 = s0.size() + 1;
    const size_t len1 = s1.size() + 1;

    std::vector<int> col(len1, 0);
    std::vector<int> prevCol(len1, 0);

    for (size_t i = 0; i < len1; i++) {
        prevCol[i] = i;
    }

    for (size_t i = 0; i < len0; i++) {
        col[0] = i;
        for (size_t j = 1; j < len1; j++) {
            col[j] = std::min(std::min(1 + col[j - 1], 1 + prevCol[j]), prevCol[j - 1] + (i > 0 && s0[i - 1] == s1[j - 1] ? 0 : 1));
        }
        col.swap(prevCol);
    }

    const float dist = prevCol[len1 - 1];

    return 1.0f - (dist / std::max(s0.size(), s1.size()));
}